

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::calc_mcu_block_order(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar3 = 0;
  uVar8 = (ulong)(uint)this->m_comps_in_frame;
  if (this->m_comps_in_frame < 1) {
    uVar8 = uVar3;
  }
  iVar6 = 0;
  iVar5 = 0;
  for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    if (iVar6 < this->m_comp_h_samp[uVar3]) {
      iVar6 = this->m_comp_h_samp[uVar3];
    }
    if (iVar5 < this->m_comp_v_samp[uVar3]) {
      iVar5 = this->m_comp_v_samp[uVar3];
    }
  }
  iVar1 = this->m_image_x_size;
  iVar2 = this->m_image_y_size;
  for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    this->m_comp_h_blocks[uVar3] =
         ((this->m_comp_h_samp[uVar3] * iVar1 + iVar6 + -1) / iVar6 + 7) / 8;
    this->m_comp_v_blocks[uVar3] =
         ((this->m_comp_v_samp[uVar3] * iVar2 + iVar5 + -1) / iVar5 + 7) / 8;
  }
  iVar7 = this->m_comps_in_scan;
  if (iVar7 == 1) {
    iVar6 = this->m_comp_list[0];
    this->m_mcus_per_row = this->m_comp_h_blocks[iVar6];
    this->m_mcus_per_col = this->m_comp_v_blocks[iVar6];
    this->m_mcu_org[0] = iVar6;
    this->m_blocks_per_mcu = 1;
  }
  else {
    this->m_mcus_per_row = ((iVar1 + 7) / 8 + iVar6 + -1) / iVar6;
    this->m_mcus_per_col = ((iVar2 + 7) / 8 + iVar5 + -1) / iVar5;
    this->m_blocks_per_mcu = 0;
    for (lVar4 = 0; lVar4 < iVar7; lVar4 = lVar4 + 1) {
      iVar6 = this->m_comp_list[lVar4];
      iVar5 = this->m_comp_v_samp[iVar6] * this->m_comp_h_samp[iVar6];
      while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
        iVar1 = this->m_blocks_per_mcu;
        this->m_blocks_per_mcu = iVar1 + 1;
        this->m_mcu_org[iVar1] = iVar6;
      }
      iVar7 = this->m_comps_in_scan;
    }
  }
  return;
}

Assistant:

void jpeg_decoder::calc_mcu_block_order()
{
  int component_num, component_id;
  int max_h_samp = 0, max_v_samp = 0;

  for (component_id = 0; component_id < m_comps_in_frame; component_id++)
  {
    if (m_comp_h_samp[component_id] > max_h_samp)
      max_h_samp = m_comp_h_samp[component_id];

    if (m_comp_v_samp[component_id] > max_v_samp)
      max_v_samp = m_comp_v_samp[component_id];
  }

  for (component_id = 0; component_id < m_comps_in_frame; component_id++)
  {
    m_comp_h_blocks[component_id] = ((((m_image_x_size * m_comp_h_samp[component_id]) + (max_h_samp - 1)) / max_h_samp) + 7) / 8;
    m_comp_v_blocks[component_id] = ((((m_image_y_size * m_comp_v_samp[component_id]) + (max_v_samp - 1)) / max_v_samp) + 7) / 8;
  }

  if (m_comps_in_scan == 1)
  {
    m_mcus_per_row = m_comp_h_blocks[m_comp_list[0]];
    m_mcus_per_col = m_comp_v_blocks[m_comp_list[0]];
  }
  else
  {
    m_mcus_per_row = (((m_image_x_size + 7) / 8) + (max_h_samp - 1)) / max_h_samp;
    m_mcus_per_col = (((m_image_y_size + 7) / 8) + (max_v_samp - 1)) / max_v_samp;
  }

  if (m_comps_in_scan == 1)
  {
    m_mcu_org[0] = m_comp_list[0];

    m_blocks_per_mcu = 1;
  }
  else
  {
    m_blocks_per_mcu = 0;

    for (component_num = 0; component_num < m_comps_in_scan; component_num++)
    {
      int num_blocks;

      component_id = m_comp_list[component_num];

      num_blocks = m_comp_h_samp[component_id] * m_comp_v_samp[component_id];

      while (num_blocks--)
        m_mcu_org[m_blocks_per_mcu++] = component_id;
    }
  }
}